

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

BasicIteratedExprBuilder<mp::CallExpr> __thiscall
mp::BasicExprFactory<std::allocator<char>_>::BeginIterated<mp::CallExpr>
          (BasicExprFactory<std::allocator<char>_> *this,Kind kind,int num_args)

{
  SafeInt<int> extra_bytes;
  BasicIteratedExprBuilder<mp::CallExpr> BVar1;
  
  extra_bytes = operator*((SafeInt<int>)0x8,num_args + -1);
  BVar1.impl_ = Allocate<mp::CallExpr>(this,kind,extra_bytes.value_);
  (BVar1.impl_)->num_args = num_args;
  BVar1._8_8_ = 0;
  return BVar1;
}

Assistant:

BasicIteratedExprBuilder<ExprType> BeginIterated(
        expr::Kind kind, int num_args) {
    MP_ASSERT(num_args >= 0, "invalid number of arguments");
    SafeInt<int> size = sizeof(Expr::Impl*);
    typename ExprType::Impl *impl =
        Allocate<ExprType>(kind, val(size * (num_args - 1)));
    impl->num_args = num_args;
    return BasicIteratedExprBuilder<ExprType>(impl);
  }